

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Socket *socket;
  size_t *psVar1;
  ulong uVar2;
  pthread_t pVar3;
  int iVar4;
  uint uVar5;
  ssize_t sVar6;
  pthread_t pVar7;
  undefined4 in_register_00000034;
  lock_guard<std::mutex> guard;
  pthread_mutex_t *__mutex;
  bool close_connection;
  Error *local_90;
  pthread_mutex_t *local_88;
  pthread_mutex_t *local_80;
  _Function_base local_78;
  anon_class_40_5_61c9469f local_58;
  
  local_88 = (pthread_mutex_t *)&this->request_mutex_;
  local_90 = (Error *)__n;
  std::recursive_mutex::lock((recursive_mutex *)&local_88->__data);
  __mutex = (pthread_mutex_t *)&this->socket_mutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  this->socket_should_be_closed_when_request_is_done_ = false;
  socket = &this->socket_;
  iVar4 = (this->socket_).sock;
  if (iVar4 == -1) {
LAB_0010d0fd:
    iVar4 = (*this->_vptr_ClientImpl[3])(this,socket,local_90);
    if ((char)iVar4 == '\0') {
      pthread_mutex_unlock(__mutex);
      uVar5 = 0;
      goto LAB_0010d263;
    }
  }
  else {
    sVar6 = detail::select_write(iVar4,0,0);
    if (sVar6 < 1) {
      (*this->_vptr_ClientImpl[4])(this,socket,0);
      shutdown_socket(this,socket);
      close_socket(this,socket);
      goto LAB_0010d0fd;
    }
  }
  uVar2 = this->socket_requests_in_flight_;
  if (uVar2 < 2) {
    pVar7 = pthread_self();
  }
  else {
    pVar3 = (this->socket_requests_are_from_thread_)._M_thread;
    local_80 = __mutex;
    pVar7 = pthread_self();
    __mutex = local_80;
    if (pVar3 != pVar7) {
      __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                    "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                    ,0x14b7,"bool httplib::ClientImpl::send(const Request &, Response &, Error &)");
    }
  }
  this->socket_requests_in_flight_ = uVar2 + 1;
  (this->socket_requests_are_from_thread_)._M_thread = pVar7;
  pthread_mutex_unlock(__mutex);
  close_connection = (bool)(this->keep_alive_ ^ 1);
  local_58.close_connection = &close_connection;
  local_58.error = local_90;
  local_58.this = this;
  local_58.req = (Request *)CONCAT44(in_register_00000034,__fd);
  local_58.res = (Response *)__buf;
  std::function<bool(httplib::Stream&)>::
  function<httplib::ClientImpl::send(httplib::Request_const&,httplib::Response&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
            ((function<bool(httplib::Stream&)> *)&local_78,&local_58);
  uVar5 = (*this->_vptr_ClientImpl[5])(this,socket,&local_78);
  std::_Function_base::~_Function_base(&local_78);
  std::mutex::lock((mutex *)&__mutex->__data);
  psVar1 = &this->socket_requests_in_flight_;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    (this->socket_requests_are_from_thread_)._M_thread = 0;
  }
  if (((this->socket_should_be_closed_when_request_is_done_ != false) || ((char)uVar5 == '\0')) ||
     (close_connection != false)) {
    (*this->_vptr_ClientImpl[4])(this,socket,1);
    shutdown_socket(this,socket);
    close_socket(this,socket);
  }
  pthread_mutex_unlock(__mutex);
  if (*local_90 == Success && (char)uVar5 == '\0') {
    *local_90 = Unknown;
  }
LAB_0010d263:
  pthread_mutex_unlock(local_88);
  return (ulong)uVar5;
}

Assistant:

inline bool ClientImpl::send(const Request &req, Response &res, Error &error) {
		std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

		{
			std::lock_guard<std::mutex> guard(socket_mutex_);
			// Set this to false immediately - if it ever gets set to true by the end of
			// the request, we know another thread instructed us to close the socket.
			socket_should_be_closed_when_request_is_done_ = false;

			auto is_alive = false;
			if (socket_.is_open()) {
				is_alive = detail::select_write(socket_.sock, 0, 0) > 0;
				if (!is_alive) {
					// Attempt to avoid sigpipe by shutting down nongracefully if it seems
					// like the other side has already closed the connection Also, there
					// cannot be any requests in flight from other threads since we locked
					// request_mutex_, so safe to close everything immediately
					const bool shutdown_gracefully = false;
					shutdown_ssl(socket_, shutdown_gracefully);
					shutdown_socket(socket_);
					close_socket(socket_);
				}
			}

			if (!is_alive) {
				if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
				// TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          bool success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
			}

			// Mark the current socket as being in use so that it cannot be closed by
			// anyone else while this request is ongoing, even though we will be
			// releasing the mutex.
			if (socket_requests_in_flight_ > 1) {
				assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
			}
			socket_requests_in_flight_ += 1;
			socket_requests_are_from_thread_ = std::this_thread::get_id();
		}

		auto close_connection = !keep_alive_;
		auto ret = process_socket(socket_, [&](Stream &strm) {
			return handle_request(strm, req, res, close_connection, error);
		});

		// Briefly lock mutex in order to mark that a request is no longer ongoing
		{
			std::lock_guard<std::mutex> guard(socket_mutex_);
			socket_requests_in_flight_ -= 1;
			if (socket_requests_in_flight_ <= 0) {
				assert(socket_requests_in_flight_ == 0);
				socket_requests_are_from_thread_ = std::thread::id();
			}

			if (socket_should_be_closed_when_request_is_done_ || close_connection ||
				!ret) {
				shutdown_ssl(socket_, true);
				shutdown_socket(socket_);
				close_socket(socket_);
			}
		}

		if (!ret) {
			if (error == Error::Success) { error = Error::Unknown; }
		}

		return ret;
	}